

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.h
# Opt level: O0

uint32_t zng_memread_4(void *ptr)

{
  void *ptr_local;
  
  return *ptr;
}

Assistant:

static inline uint32_t zng_memread_4(const void *ptr) {
#if defined(HAVE_MAY_ALIAS)
    typedef struct { uint32_t val; } __attribute__ ((__packed__, __may_alias__)) unaligned_uint32_t;
    return ((const unaligned_uint32_t *)ptr)->val;
#else
    uint32_t val;
    memcpy(&val, ptr, sizeof(val));
    return val;
#endif
}